

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::SectionStats::SectionStats(SectionStats *this,SectionStats *param_1)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  
  this->_vptr_SectionStats = (_func_int **)&PTR__SectionStats_001b3a90;
  (this->sectionInfo).name._M_dataplus._M_p = (pointer)&(this->sectionInfo).name.field_2;
  pcVar1 = (param_1->sectionInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->sectionInfo,pcVar1,
             pcVar1 + (param_1->sectionInfo).name._M_string_length);
  (this->sectionInfo).description._M_dataplus._M_p =
       (pointer)&(this->sectionInfo).description.field_2;
  pcVar1 = (param_1->sectionInfo).description._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sectionInfo).description,pcVar1,
             pcVar1 + (param_1->sectionInfo).description._M_string_length);
  sVar2 = (param_1->sectionInfo).lineInfo.line;
  (this->sectionInfo).lineInfo.file = (param_1->sectionInfo).lineInfo.file;
  (this->sectionInfo).lineInfo.line = sVar2;
  sVar2 = (param_1->assertions).failed;
  sVar3 = (param_1->assertions).failedButOk;
  dVar4 = param_1->durationInSeconds;
  (this->assertions).passed = (param_1->assertions).passed;
  (this->assertions).failed = sVar2;
  (this->assertions).failedButOk = sVar3;
  this->durationInSeconds = dVar4;
  this->missingAssertions = param_1->missingAssertions;
  return;
}

Assistant:

SectionStats( SectionStats const& )              = default;